

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O3

void __thiscall
UnifiedRegex::CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::Inner::FreeSelf
          (Inner *this,ArenaAllocator *allocator)

{
  Node *pNVar1;
  long lVar2;
  
  lVar2 = 1;
  do {
    pNVar1 = this->children[lVar2 + -1];
    if (pNVar1 != (Node *)0x0) {
      (**pNVar1->_vptr_Node)(pNVar1,allocator);
      this->children[lVar2 + -1] = (Node *)0x0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x11);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            (&allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             this,0x88);
  return;
}

Assistant:

void FreeSelf(ArenaAllocator* allocator) override
            {
                for (int i = 0; i < branchingPerLevel; i++)
                {
                    if (children[i] != 0)
                    {
                        children[i]->FreeSelf(allocator);
#if DBG
                        children[i] = 0;
#endif
                    }
                }
                Adelete(allocator, this);
            }